

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O3

size_t nlohmann::detail::
       serializer<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
       ::extra_space(string_t *s,bool ensure_ascii)

{
  byte bVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  if (s->_M_string_length == 0) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    uVar3 = 0;
    do {
      bVar1 = (s->_M_dataplus)._M_p[uVar3];
      uVar4 = (ulong)bVar1;
      if (uVar4 < 0x23) {
        if ((0xffffc8ffUL >> (uVar4 & 0x3f) & 1) != 0) {
          sVar2 = sVar2 + 5;
          goto LAB_0010ffcf;
        }
        if ((0x400003700U >> (uVar4 & 0x3f) & 1) == 0) goto LAB_0010ffd9;
LAB_0010ffcc:
        sVar2 = sVar2 + 1;
      }
      else {
LAB_0010ffd9:
        if (bVar1 == 0x5c) goto LAB_0010ffcc;
        if (ensure_ascii) {
          if ((char)bVar1 < '\0') {
            lVar5 = 1;
            if (((bVar1 & 0xe0) == 0xc0) || (lVar5 = 2, (bVar1 & 0xf0) == 0xe0)) goto LAB_00110016;
            if ((bVar1 & 0xf8) != 0xf0) {
              __assert_fail("bytes != std::string::npos",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/zek[P]Bridge-Game/json.hh"
                            ,0x18f8,
                            "static std::size_t nlohmann::detail::serializer<nlohmann::basic_json<>>::extra_space(const string_t &, const bool) [BasicJsonType = nlohmann::basic_json<>]"
                           );
            }
            sVar2 = sVar2 + 8;
            lVar5 = 3;
          }
          else {
            if (bVar1 != 0x7f) goto LAB_0010ffcf;
            lVar5 = 0;
LAB_00110016:
            sVar2 = (sVar2 - lVar5) + 5;
          }
          uVar3 = uVar3 + lVar5;
        }
      }
LAB_0010ffcf:
      uVar3 = uVar3 + 1;
    } while (uVar3 < s->_M_string_length);
  }
  return sVar2;
}

Assistant:

static std::size_t extra_space(const string_t& s,
                                   const bool ensure_ascii) noexcept
    {
        std::size_t res = 0;

        for (std::size_t i = 0; i < s.size(); ++i)
        {
            switch (s[i])
            {
                // control characters that can be escaped with a backslash
                case '"':
                case '\\':
                case '\b':
                case '\f':
                case '\n':
                case '\r':
                case '\t':
                {
                    // from c (1 byte) to \x (2 bytes)
                    res += 1;
                    break;
                }

                // control characters that need \uxxxx escaping
                case 0x00:
                case 0x01:
                case 0x02:
                case 0x03:
                case 0x04:
                case 0x05:
                case 0x06:
                case 0x07:
                case 0x0B:
                case 0x0E:
                case 0x0F:
                case 0x10:
                case 0x11:
                case 0x12:
                case 0x13:
                case 0x14:
                case 0x15:
                case 0x16:
                case 0x17:
                case 0x18:
                case 0x19:
                case 0x1A:
                case 0x1B:
                case 0x1C:
                case 0x1D:
                case 0x1E:
                case 0x1F:
                {
                    // from c (1 byte) to \uxxxx (6 bytes)
                    res += 5;
                    break;
                }

                default:
                {
                    if (ensure_ascii and (s[i] & 0x80 or s[i] == 0x7F))
                    {
                        const auto bytes = bytes_following(static_cast<uint8_t>(s[i]));
                        // invalid characters will be detected by throw_if_invalid_utf8
                        assert (bytes != std::string::npos);

                        if (bytes == 3)
                        {
                            // codepoints that need 4 bytes (i.e., 3 additional
                            // bytes) in UTF-8 need a surrogate pair when \u
                            // escaping is used: from 4 bytes to \uxxxx\uxxxx
                            // (12 bytes)
                            res += (12 - bytes - 1);
                        }
                        else
                        {
                            // from x bytes to \uxxxx (6 bytes)
                            res += (6 - bytes - 1);
                        }

                        // skip the additional bytes
                        i += bytes;
                    }
                    break;
                }
            }
        }

        return res;
    }